

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

TiXmlAttribute * __thiscall TiXmlAttributeSet::FindOrCreate(TiXmlAttributeSet *this,char *_name)

{
  int iVar1;
  TiXmlAttribute *pTVar2;
  size_t len;
  
  pTVar2 = &this->sentinel;
  do {
    pTVar2 = pTVar2->next;
    if (pTVar2 == &this->sentinel) {
      pTVar2 = (TiXmlAttribute *)operator_new(0x40);
      (pTVar2->super_TiXmlBase).location.row = -1;
      (pTVar2->super_TiXmlBase).location.col = -1;
      (pTVar2->super_TiXmlBase).userData = (void *)0x0;
      pTVar2->document = (TiXmlDocument *)0x0;
      (pTVar2->super_TiXmlBase)._vptr_TiXmlBase = (_func_int **)&PTR__TiXmlAttribute_00216c08;
      (pTVar2->name).rep_ = &TiXmlString::nullrep_;
      (pTVar2->value).rep_ = &TiXmlString::nullrep_;
      pTVar2->prev = (TiXmlAttribute *)0x0;
      pTVar2->next = (TiXmlAttribute *)0x0;
      Add(this,pTVar2);
      len = strlen(_name);
      TiXmlString::assign(&pTVar2->name,_name,len);
      return pTVar2;
    }
    iVar1 = strcmp(((pTVar2->name).rep_)->str,_name);
  } while (iVar1 != 0);
  return pTVar2;
}

Assistant:

TiXmlAttribute* TiXmlAttributeSet::FindOrCreate( const char* _name )
{
	TiXmlAttribute* attrib = Find( _name );
	if ( !attrib ) {
		attrib = new TiXmlAttribute();
		Add( attrib );
		attrib->SetName( _name );
	}
	return attrib;
}